

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSLTokenizer.cpp
# Opt level: O1

TokenListType * __thiscall
Diligent::Parsing::HLSLTokenizer::Tokenize
          (TokenListType *__return_storage_ptr__,HLSLTokenizer *this,String *Source)

{
  byte bVar1;
  char cVar2;
  _List_node_base *p_Var3;
  char *pcVar4;
  int iVar5;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var6;
  __node_base_ptr p_Var7;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var8;
  undefined8 *puVar9;
  long lVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  TokenType _Type;
  _Hash_node_base *p_Var12;
  bool bVar13;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  Pos;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  DelimStart;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  LiteralStart;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  DelimEnd;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  LiteralEnd;
  string _msg;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  _List_node_base *local_110;
  const_iterator local_108;
  const_iterator local_100;
  const_iterator local_f8;
  undefined1 local_f0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  _Alloc_hider local_c8;
  size_type local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  size_t local_a8;
  _List_node_base **local_a0;
  const_iterator local_98;
  size_t local_90;
  HashMapStringKey local_88 [2];
  _List_node_base *local_68;
  char *local_60;
  _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::Parsing::HLSLTokenInfo>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::Parsing::HLSLTokenInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_58;
  
  local_60 = (Source->_M_dataplus)._M_p;
  local_118._M_current = local_60 + Source->_M_string_length;
  (__return_storage_ptr__->
  super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
  )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
  )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
  )._M_impl._M_node._M_size = 0;
  local_f0._0_8_ = local_f0._0_8_ & 0xffffffff00000000;
  local_f0._16_8_ = 0;
  local_d8._M_local_buf[0] = '\0';
  local_c0 = 0;
  local_b8._M_local_buf[0] = '\0';
  local_a8 = 0xffffffffffffffff;
  local_f0._8_8_ = &local_d8;
  local_c8._M_p = (pointer)&local_b8;
  local_58 = (_Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::Parsing::HLSLTokenInfo>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::Parsing::HLSLTokenInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)this;
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
  _M_insert<Diligent::Parsing::HLSLTokenInfo>
            (__return_storage_ptr__,(iterator)__return_storage_ptr__,(HLSLTokenInfo *)local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_p != &local_b8) {
    operator_delete(local_c8._M_p,
                    CONCAT71(local_b8._M_allocated_capacity._1_7_,local_b8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._8_8_ != &local_d8) {
    operator_delete((void *)local_f0._8_8_,
                    CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]) + 1);
  }
  local_120._M_current = local_60;
  if (local_118._M_current != local_60) {
    local_90 = 0;
    do {
      local_108._M_current = local_120._M_current;
      _Var6 = SkipDelimitersAndComments<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        (&local_120,&local_118,(char *)0x0,SKIP_COMMENT_FLAG_ALL);
      local_98._M_current = local_108._M_current;
      local_120 = _Var6;
      local_100._M_current = _Var6._M_current;
      local_f8._M_current = _Var6._M_current;
      if (_Var6._M_current == local_118._M_current) {
        HLSLTokenInfo::Create
                  ((HLSLTokenInfo *)local_f0,Undefined,&local_108,&local_f8,&local_100,&local_120,
                   local_90);
        std::__cxx11::
        list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
        _M_insert<Diligent::Parsing::HLSLTokenInfo>
                  (__return_storage_ptr__,(iterator)__return_storage_ptr__,(HLSLTokenInfo *)local_f0
                  );
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_p != &local_b8) {
          operator_delete(local_c8._M_p,
                          CONCAT71(local_b8._M_allocated_capacity._1_7_,local_b8._M_local_buf[0]) +
                          1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._8_8_ == &local_d8) {
          return __return_storage_ptr__;
        }
        operator_delete((void *)local_f0._8_8_,
                        CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]) + 1)
        ;
        return __return_storage_ptr__;
      }
      bVar1 = *_Var6._M_current;
      if (0x5c < bVar1) {
        switch(bVar1) {
        case 0x7b:
          _Type = OpenBrace;
          _Var8._M_current = _Var6._M_current + 1;
          break;
        case 0x7c:
          goto switchD_00249e90_caseD_26;
        case 0x7d:
          _Type = ClosingBrace;
          _Var8._M_current = _Var6._M_current + 1;
          break;
        case 0x7e:
switchD_00249eb6_caseD_7e:
          _Type = BitwiseOp;
          _Var8._M_current = _Var6._M_current + 1;
          break;
        default:
          if (bVar1 != 0x5d) {
            if (bVar1 != 0x5e) goto switchD_00249e90_caseD_24;
            goto switchD_00249eb6_caseD_7e;
          }
          _Type = ClosingSquareBracket;
          _Var8._M_current = _Var6._M_current + 1;
        }
        goto LAB_0024a5ae;
      }
      switch(bVar1) {
      case 0x21:
        _Type = LogicOp;
        _Var8._M_current = _Var6._M_current + 1;
        break;
      case 0x22:
        local_100._M_current = _Var6._M_current + 1;
        pcVar4 = _Var6._M_current + 1;
        while( true ) {
          local_120._M_current = pcVar4;
          if (local_120._M_current == local_118._M_current) goto LAB_0024a75a;
          if (*local_120._M_current == '\"') break;
          pcVar4 = local_120._M_current + 1;
          if (*local_120._M_current == '\0') {
LAB_0024a75a:
            local_110 = (_List_node_base *)__return_storage_ptr__;
            puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
            *puVar9 = local_100._M_current + -1;
            puVar9[1] = "Unable to find matching closing quotes.";
            __cxa_throw(puVar9,&std::
                                pair<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                                ::typeinfo,0);
          }
        }
        _Type = StringConstant;
        _Var8._M_current = local_120._M_current + 1;
        local_98._M_current = local_120._M_current;
        break;
      case 0x23:
        do {
          local_120._M_current = local_120._M_current + 1;
          if (local_120._M_current == local_118._M_current) break;
        } while ((*local_120._M_current == ' ') || (*local_120._M_current == '\t'));
        if ((local_120._M_current == local_118._M_current) ||
           (cVar2 = *local_120._M_current, cVar2 == '\0')) {
LAB_0024a792:
          local_110 = (_List_node_base *)__return_storage_ptr__;
          puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
          *puVar9 = local_100._M_current;
          puVar9[1] = "Missing preprocessor directive.";
          __cxa_throw(puVar9,&std::
                              pair<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                              ::typeinfo,0);
        }
        if (cVar2 == '/') {
          local_110 = (_List_node_base *)__return_storage_ptr__;
          puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
          *puVar9 = local_100._M_current;
          puVar9[1] = "Comments between # and preprocessor directive are currently not supported.";
          __cxa_throw(puVar9,&std::
                              pair<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                              ::typeinfo,0);
        }
        if (cVar2 == '\n') goto LAB_0024a792;
        _Var8 = SkipIdentifier<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                          (&local_120,&local_118);
        _Type = PreprocessorDirective;
        break;
      case 0x24:
      case 0x27:
      case 0x2e:
      case 0x30:
      case 0x31:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x35:
      case 0x36:
      case 0x37:
      case 0x38:
      case 0x39:
switchD_00249e90_caseD_24:
        local_120 = SkipIdentifier<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                              (&local_120,&local_118);
        if (local_100._M_current == local_120._M_current) {
          local_120 = SkipFloatNumber<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                                (&local_120,&local_118);
          _Type = NumericConstant;
          if (local_100._M_current == local_120._M_current) {
            _Type = Undefined;
          }
        }
        else {
          local_f0._0_8_ = local_f0 + 0x10;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)local_f0,local_100._M_current,local_120._M_current);
          HashMapStringKey::HashMapStringKey(local_88,(Char *)local_f0._0_8_,true);
          p_Var7 = std::
                   _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::Parsing::HLSLTokenInfo>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::Parsing::HLSLTokenInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::_M_find_before_node
                             (local_58,(local_88[0].Ownership_Hash & 0x7fffffffffffffff) %
                                       local_58->_M_bucket_count,local_88,
                              local_88[0].Ownership_Hash & 0x7fffffffffffffff);
          if (p_Var7 == (__node_base_ptr)0x0) {
            p_Var12 = (_Hash_node_base *)0x0;
          }
          else {
            p_Var12 = p_Var7->_M_nxt;
          }
          if ((local_88[0].Str != (Char *)0x0) && ((long)local_88[0].Ownership_Hash < 0)) {
            operator_delete__(local_88[0].Str);
          }
          local_88[0].Str = (Char *)0x0;
          local_88[0].Ownership_Hash = 0;
          if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
            operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
          }
          if (p_Var12 == (_Hash_node_base *)0x0) {
            _Type = Identifier;
          }
          else {
            local_f0._0_8_ = local_f0 + 0x10;
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((string *)local_f0,local_100._M_current,local_120._M_current);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._8_8_ ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)p_Var12[5]._M_nxt) {
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._8_8_ ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                bVar13 = true;
              }
              else {
                iVar5 = bcmp((void *)local_f0._0_8_,p_Var12[4]._M_nxt,local_f0._8_8_);
                bVar13 = iVar5 == 0;
              }
            }
            else {
              bVar13 = false;
            }
            if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
              operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
            }
            if (!bVar13) {
              FormatString<char[21]>((string *)local_f0,(char (*) [21])"Inconsistent literal");
              DebugAssertionFailed
                        ((Char *)local_f0._0_8_,"operator()",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/HLSLTokenizer.cpp"
                         ,0x3f);
              if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
                operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
              }
            }
            _Type = *(TokenType *)&p_Var12[3]._M_nxt;
          }
          if (_Type == Undefined) {
            _Type = Identifier;
          }
        }
        _Var8._M_current = local_120._M_current;
        if (_Type == Undefined) {
          _Type = Undefined;
          _Var8._M_current = local_120._M_current + 1;
        }
        break;
      case 0x25:
      case 0x2a:
      case 0x2f:
LAB_00249f90:
        local_120._M_current = local_120._M_current + 1;
        _Type = MathOp;
        _Var8._M_current = local_120._M_current;
        break;
      case 0x26:
switchD_00249e90_caseD_26:
        if (((((_List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                *)&((_List_node_base *)__return_storage_ptr__)->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next == (_List_node_base *)__return_storage_ptr__) ||
           (local_108._M_current != _Var6._M_current)) goto switchD_00249eb6_caseD_7e;
        p_Var3 = ((_List_node_base *)__return_storage_ptr__)->_M_prev;
        if (p_Var3[2]._M_next != (_List_node_base *)0x1 ||
            *(byte *)&(p_Var3[1]._M_prev)->_M_next != bVar1) goto switchD_00249eb6_caseD_7e;
        *(undefined4 *)&p_Var3[1]._M_next = 0x146;
        std::__cxx11::string::replace
                  ((ulong)&p_Var3[1]._M_prev,(ulong)p_Var3[2]._M_next,(char *)0x0,
                   (ulong)_Var6._M_current);
LAB_0024a4dd:
        local_120._M_current = local_120._M_current + 1;
        goto LAB_0024a648;
      case 0x28:
        _Type = OpenParen;
        _Var8._M_current = _Var6._M_current + 1;
        break;
      case 0x29:
        _Type = ClosingParen;
        _Var8._M_current = _Var6._M_current + 1;
        break;
      case 0x2b:
      case 0x2d:
        _Type = Undefined;
        iVar5 = 0;
        if (((_List_node_base *)__return_storage_ptr__)->_M_next !=
            (_List_node_base *)__return_storage_ptr__) {
          if (local_108._M_current == _Var6._M_current) {
            p_Var3 = ((_List_node_base *)__return_storage_ptr__)->_M_prev;
            if (p_Var3[2]._M_next == (_List_node_base *)0x1 &&
                *(byte *)&(p_Var3[1]._M_prev)->_M_next == bVar1) {
              *(undefined4 *)&p_Var3[1]._M_next = 0x148;
              std::__cxx11::string::replace
                        ((ulong)&p_Var3[1]._M_prev,(ulong)p_Var3[2]._M_next,(char *)0x0,
                         (ulong)_Var6._M_current);
              goto LAB_0024a4dd;
            }
          }
          iVar5 = *(int *)&((_List_node_base *)__return_storage_ptr__)->_M_prev[1]._M_next;
        }
        if ((6 < iVar5 - 0x136U) || (bVar13 = true, (0x65U >> (iVar5 - 0x136U & 0x1f) & 1) == 0)) {
          _Var8 = SkipFloatNumber<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                            (&local_120,&local_118);
          bVar13 = local_120._M_current == _Var8._M_current;
          if (!bVar13) {
            _Type = NumericConstant;
            bVar13 = false;
            local_120 = _Var8;
          }
        }
        _Var8._M_current = local_120._M_current;
        if (bVar13) goto LAB_00249f90;
        break;
      case 0x2c:
        _Type = Comma;
        _Var8._M_current = _Var6._M_current + 1;
        break;
      case 0x3a:
        if ((((_List_node_base *)__return_storage_ptr__)->_M_next !=
             (_List_node_base *)__return_storage_ptr__) &&
           (local_108._M_current == _Var6._M_current)) {
          p_Var3 = ((_List_node_base *)__return_storage_ptr__)->_M_prev;
          if (p_Var3[2]._M_next == (_List_node_base *)0x1 &&
              *(byte *)&(p_Var3[1]._M_prev)->_M_next == bVar1) {
            *(undefined4 *)&p_Var3[1]._M_next = 0x141;
            std::__cxx11::string::replace
                      ((ulong)&p_Var3[1]._M_prev,(ulong)p_Var3[2]._M_next,(char *)0x0,
                       (ulong)_Var6._M_current);
            goto LAB_0024a4dd;
          }
        }
        _Type = Colon;
        _Var8._M_current = _Var6._M_current + 1;
        break;
      case 0x3b:
        _Type = Semicolon;
        _Var8._M_current = _Var6._M_current + 1;
        break;
      case 0x3c:
      case 0x3e:
        if ((((_List_node_base *)__return_storage_ptr__)->_M_next !=
             (_List_node_base *)__return_storage_ptr__) &&
           (local_108._M_current == _Var6._M_current)) {
          p_Var3 = ((_List_node_base *)__return_storage_ptr__)->_M_prev;
          if (p_Var3[2]._M_next == (_List_node_base *)0x1 &&
              *(byte *)&(p_Var3[1]._M_prev)->_M_next == bVar1) {
            *(undefined4 *)&p_Var3[1]._M_next = 0x147;
            std::__cxx11::string::replace
                      ((ulong)&p_Var3[1]._M_prev,(ulong)p_Var3[2]._M_next,(char *)0x0,
                       (ulong)_Var6._M_current);
            goto LAB_0024a4dd;
          }
        }
        _Type = ComparisonOp;
        _Var8._M_current = _Var6._M_current + 1;
        break;
      case 0x3d:
        if ((((_List_node_base *)__return_storage_ptr__)->_M_next ==
             (_List_node_base *)__return_storage_ptr__) ||
           (local_108._M_current != _Var6._M_current)) {
LAB_0024a509:
          _Type = Assignment;
          _Var8._M_current = local_120._M_current + 1;
          break;
        }
        local_68 = ((_List_node_base *)__return_storage_ptr__)->_M_prev;
        local_a0 = &local_68[1]._M_prev;
        bVar13 = false;
        lVar10 = 0;
        local_110 = (_List_node_base *)__return_storage_ptr__;
        do {
          iVar5 = std::__cxx11::string::compare((char *)local_a0);
          if (iVar5 == 0) {
            *(undefined4 *)&local_68[1]._M_next = 0x144;
            std::__cxx11::string::replace
                      ((ulong)local_a0,(ulong)local_68[2]._M_next,(char *)0x0,
                       (ulong)local_120._M_current);
            local_120._M_current = local_120._M_current + 1;
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(ulong)(local_120._M_current != local_118._M_current);
            break;
          }
          lVar10 = lVar10 + 8;
          bVar13 = lVar10 == 0x50;
          paVar11 = &local_b8;
        } while (!bVar13);
        if (bVar13) {
          bVar13 = false;
          lVar10 = 0;
          do {
            iVar5 = std::__cxx11::string::compare((char *)local_a0);
            if (iVar5 == 0) {
              *(undefined4 *)&local_68[1]._M_next = 0x145;
              std::__cxx11::string::replace
                        ((ulong)local_a0,(ulong)local_68[2]._M_next,(char *)0x0,
                         (ulong)local_120._M_current);
              local_120._M_current = local_120._M_current + 1;
              paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(ulong)(local_120._M_current != local_118._M_current);
              break;
            }
            lVar10 = lVar10 + 8;
            bVar13 = lVar10 == 0x20;
          } while (!bVar13);
        }
        else {
          bVar13 = false;
        }
        __return_storage_ptr__ = (TokenListType *)local_110;
        if (bVar13) goto LAB_0024a509;
        goto LAB_0024a651;
      case 0x3f:
        _Type = QuestionMark;
        _Var8._M_current = _Var6._M_current + 1;
        break;
      default:
        if (bVar1 != 0x5b) goto switchD_00249e90_caseD_24;
        _Type = OpenSquareBracket;
        _Var8._M_current = _Var6._M_current + 1;
      }
LAB_0024a5ae:
      local_120._M_current = _Var8._M_current;
      if (local_98._M_current == local_108._M_current) {
        local_98._M_current = local_120._M_current;
      }
      HLSLTokenInfo::Create
                ((HLSLTokenInfo *)local_f0,_Type,&local_108,&local_f8,&local_100,&local_98,local_90)
      ;
      std::__cxx11::
      list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
      _M_insert<Diligent::Parsing::HLSLTokenInfo>
                (__return_storage_ptr__,(iterator)__return_storage_ptr__,(HLSLTokenInfo *)local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_p != &local_b8) {
        operator_delete(local_c8._M_p,
                        CONCAT71(local_b8._M_allocated_capacity._1_7_,local_b8._M_local_buf[0]) + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._8_8_ != &local_d8) {
        operator_delete((void *)local_f0._8_8_,
                        CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]) + 1)
        ;
      }
      local_90 = local_90 + 1;
LAB_0024a648:
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(ulong)(local_120._M_current != local_118._M_current);
LAB_0024a651:
      if (((ulong)paVar11 & 1) == 0) {
        return __return_storage_ptr__;
      }
      if (_Var6._M_current == local_120._M_current && local_120._M_current != local_118._M_current)
      {
        FormatString<char[46]>
                  ((string *)local_f0,(char (*) [46])"Position has not been updated by the handler."
                  );
        DebugAssertionFailed
                  ((Char *)local_f0._0_8_,"SplitString",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/ParsingTools.hpp"
                   ,0x1e8);
        if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
          operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
        }
      }
    } while (local_120._M_current != local_118._M_current);
  }
  return (TokenListType *)(_List_node_base *)__return_storage_ptr__;
}

Assistant:

HLSLTokenizer::TokenListType HLSLTokenizer::Tokenize(const String& Source) const
{
    try
    {
        size_t TokenIdx = 0;
        return Parsing::Tokenize<HLSLTokenInfo, TokenListType>(
            Source.begin(), Source.end(),
            [&TokenIdx](HLSLTokenType                      Type,
                        const std::string::const_iterator& DelimStart,
                        const std::string::const_iterator& DelimEnd,
                        const std::string::const_iterator& LiteralStart,
                        const std::string::const_iterator& LiteralEnd) //
            {
                return HLSLTokenInfo::Create(Type, DelimStart, DelimEnd, LiteralStart, LiteralEnd, TokenIdx++);
            },
            [&](const std::string::const_iterator& Start, const std::string::const_iterator& End) //
            {
                auto KeywordIt = m_Keywords.find(HashMapStringKey{std::string{Start, End}});
                if (KeywordIt != m_Keywords.end())
                {
                    VERIFY(std::string(Start, End) == KeywordIt->second.Literal, "Inconsistent literal");
                    return KeywordIt->second.Type;
                }
                return HLSLTokenType::Identifier;
            });
    }
    catch (...)
    {
        return {};
    }
}